

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O0

uc_afl_ret __thiscall UCAFL::fsrv_run(UCAFL *this)

{
  double __x;
  uc_afl_ret ret;
  UCAFL *this_local;
  
  _may_use_shm_testcase(this);
  _afl_setup(this);
  if ((this->has_afl_ & 1U) != 0) {
    _uc_setup(this);
  }
  this_local._4_4_ = _fksrv_start(this);
  log(__x);
  switch(this_local._4_4_) {
  case UC_AFL_RET_ERROR:
  case UC_AFL_RET_CALLED_TWICE:
  case UC_AFL_RET_FINISHED:
    break;
  case UC_AFL_RET_CHILD:
    this_local._4_4_ = _child_fuzz(this,true);
    break;
  case UC_AFL_RET_NO_AFL:
    this->persistent_iters_ = 1;
    this_local._4_4_ = _child_fuzz(this,false);
    break;
  default:
    this_local._4_4_ = UC_AFL_RET_ERROR;
  }
  return this_local._4_4_;
}

Assistant:

uc_afl_ret fsrv_run() {
        uc_afl_ret ret;
        this->_may_use_shm_testcase();
        this->_afl_setup();
        if (this->has_afl_) {
            this->_uc_setup();
        }

        ret = this->_fksrv_start();

        ERR("fksrv_start returns %d\n", ret);

        switch (ret) {
        case UC_AFL_RET_CHILD:
            // We are the child.
            return this->_child_fuzz(true);
        case UC_AFL_RET_NO_AFL:
            this->persistent_iters_ = 1;
            // Only run once.
            return this->_child_fuzz(false);
        case UC_AFL_RET_FINISHED:
        case UC_AFL_RET_ERROR:
        case UC_AFL_RET_CALLED_TWICE:
            return ret;
        default:
            return UC_AFL_RET_ERROR;
        }
    }